

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneLight * __thiscall
CGL::Application::init_light(Application *this,LightInfo *light,Matrix4x4 *transform)

{
  long in_RSI;
  Matrix4x4 *unaff_retaddr;
  LightInfo *in_stack_00000008;
  PointLight *in_stack_00000010;
  Matrix4x4 *in_stack_00000070;
  LightInfo *in_stack_00000078;
  DirectionalLight *in_stack_00000080;
  Matrix4x4 *in_stack_00000090;
  LightInfo *in_stack_00000098;
  SpotLight *in_stack_000000a0;
  Matrix4x4 *in_stack_000001e0;
  LightInfo *in_stack_000001e8;
  AreaLight *in_stack_000001f0;
  LightInfo *in_stack_ffffffffffffff98;
  AmbientLight *in_stack_ffffffffffffffa0;
  SceneLight *local_8;
  
  switch(*(undefined4 *)(in_RSI + 0x48)) {
  case 0:
  default:
    local_8 = (SceneLight *)0x0;
    break;
  case 1:
    local_8 = (SceneLight *)operator_new(0x30);
    GLScene::AmbientLight::AmbientLight(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    break;
  case 2:
    local_8 = (SceneLight *)operator_new(0x70);
    GLScene::DirectionalLight::DirectionalLight
              (in_stack_00000080,in_stack_00000078,in_stack_00000070);
    break;
  case 3:
    local_8 = (SceneLight *)operator_new(0xb0);
    GLScene::AreaLight::AreaLight(in_stack_000001f0,in_stack_000001e8,in_stack_000001e0);
    break;
  case 4:
    local_8 = (SceneLight *)operator_new(0x50);
    GLScene::PointLight::PointLight(in_stack_00000010,in_stack_00000008,unaff_retaddr);
    break;
  case 5:
    local_8 = (SceneLight *)operator_new(0x70);
    GLScene::SpotLight::SpotLight(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
  }
  return local_8;
}

Assistant:

GLScene::SceneLight *Application::init_light(LightInfo& light,
                                        const Matrix4x4& transform) {
  switch(light.light_type) {
    case Collada::LightType::NONE:
      break;
    case Collada::LightType::AMBIENT:
      return new GLScene::AmbientLight(light);
    case Collada::LightType::DIRECTIONAL:
      return new GLScene::DirectionalLight(light, transform);
    case Collada::LightType::AREA:
      return new GLScene::AreaLight(light, transform);
    case Collada::LightType::POINT:
      return new GLScene::PointLight(light, transform);
    case Collada::LightType::SPOT:
      return new GLScene::SpotLight(light, transform);
    default:
      break;
  }
  return nullptr;
}